

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MS3DImporter::CollectChildJoints
          (MS3DImporter *this,
          vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          *joints,vector<bool,_std::allocator<bool>_> *hadit,aiNode *nd,aiMatrix4x4 *absTrafo)

{
  char *__s2;
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pTVar4;
  aiMesh *paVar5;
  aiBone *this_00;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  bool bVar22;
  int iVar23;
  aiNode **ppaVar24;
  aiNode *this_01;
  aiMatrix4x4t<float> *paVar25;
  size_t i;
  ulong uVar26;
  uint uVar27;
  uint a;
  ulong uVar28;
  uint n;
  long lVar29;
  ulong uVar30;
  reference rVar31;
  uint local_104;
  aiMatrix4x4 abs;
  aiMatrix4x4t<float> local_78;
  
  __s2 = (nd->mName).data;
  lVar29 = 0x21;
  uVar27 = 0;
  for (uVar26 = 0;
      uVar26 < (ulong)(((long)(joints->
                              super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(joints->
                             super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0xb0);
      uVar26 = uVar26 + 1) {
    rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[](hadit,uVar26);
    if ((*rVar31._M_p & rVar31._M_mask) == 0) {
      iVar23 = strcmp(((joints->
                       super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                       )._M_impl.super__Vector_impl_data._M_start)->name + lVar29,__s2);
      uVar27 = uVar27 + (iVar23 == 0);
    }
    lVar29 = lVar29 + 0xb0;
  }
  nd->mNumChildren = uVar27;
  ppaVar24 = (aiNode **)operator_new__((ulong)uVar27 << 3);
  nd->mChildren = ppaVar24;
  local_104 = 0;
  for (uVar26 = 0;
      uVar26 < (ulong)(((long)(joints->
                              super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(joints->
                             super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0xb0);
      uVar26 = uVar26 + 1) {
    rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[](hadit,uVar26);
    if ((*rVar31._M_p & rVar31._M_mask) == 0) {
      pTVar4 = (joints->
               super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar23 = strcmp(pTVar4[uVar26].parentName,__s2);
      if (iVar23 == 0) {
        this_01 = (aiNode *)operator_new(0x478);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&abs,pTVar4[uVar26].name,(allocator<char> *)&local_78);
        aiNode::aiNode(this_01,(string *)&abs);
        nd->mChildren[local_104] = this_01;
        std::__cxx11::string::~string((string *)&abs);
        this_01->mParent = nd;
        pTVar4 = (joints->
                 super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        fVar1 = pTVar4[uVar26].position.x;
        fVar2 = pTVar4[uVar26].position.y;
        fVar3 = pTVar4[uVar26].position.z;
        local_78.a1 = 1.0;
        local_78.a2 = 0.0;
        local_78.a3 = 0.0;
        local_78.a4 = 0.0;
        local_78.b1 = 0.0;
        local_78.b2 = 1.0;
        local_78.b3 = 0.0;
        local_78.b4 = 0.0;
        local_78.c1 = 0.0;
        local_78.c2 = 0.0;
        local_78.c3 = 1.0;
        local_78.c4 = 0.0;
        local_78.d1 = 0.0;
        local_78.d2 = 0.0;
        local_78.d3 = 0.0;
        local_78.d4 = 1.0;
        paVar25 = aiMatrix4x4t<float>::FromEulerAnglesXYZ(&local_78,&pTVar4[uVar26].rotation);
        abs.a1 = 1.0;
        abs.a2 = 0.0;
        abs.a3 = 0.0;
        abs.b1 = 0.0;
        abs.b2 = 1.0;
        abs._24_8_ = (ulong)(uint)fVar2 << 0x20;
        abs.c1 = 0.0;
        abs.c2 = 0.0;
        abs.c4 = fVar3;
        abs.c3 = 1.0;
        abs.d1 = 0.0;
        abs.d2 = 0.0;
        abs.d3 = 0.0;
        abs.d4 = 1.0;
        abs.a4 = fVar1;
        aiMatrix4x4t<float>::operator*=(&abs,paVar25);
        (this_01->mTransformation).a1 = abs.a1;
        (this_01->mTransformation).a2 = abs.a2;
        (this_01->mTransformation).a3 = abs.a3;
        (this_01->mTransformation).a4 = abs.a4;
        (this_01->mTransformation).b1 = abs.b1;
        (this_01->mTransformation).b2 = abs.b2;
        (this_01->mTransformation).b3 = abs.b3;
        (this_01->mTransformation).b4 = abs.b4;
        (this_01->mTransformation).c1 = abs.c1;
        (this_01->mTransformation).c2 = abs.c2;
        (this_01->mTransformation).c3 = abs.c3;
        (this_01->mTransformation).c4 = abs.c4;
        (this_01->mTransformation).d1 = abs.d1;
        (this_01->mTransformation).d2 = abs.d2;
        (this_01->mTransformation).d3 = abs.d3;
        (this_01->mTransformation).d4 = abs.d4;
        uVar6 = absTrafo->a1;
        uVar7 = absTrafo->a2;
        uVar8 = absTrafo->a3;
        uVar9 = absTrafo->a4;
        abs.b1 = absTrafo->b1;
        abs.b2 = absTrafo->b2;
        abs.b3 = absTrafo->b3;
        abs.b4 = absTrafo->b4;
        abs.c1 = absTrafo->c1;
        abs.c2 = absTrafo->c2;
        abs.c3 = absTrafo->c3;
        abs.c4 = absTrafo->c4;
        abs.d1 = absTrafo->d1;
        abs.d2 = absTrafo->d2;
        abs.d3 = absTrafo->d3;
        abs.d4 = absTrafo->d4;
        abs.a1 = (float)uVar6;
        abs.a2 = (float)uVar7;
        abs.a3 = (float)uVar8;
        abs.a4 = (float)uVar9;
        aiMatrix4x4t<float>::operator*=(&abs,&this_01->mTransformation);
        for (uVar28 = 0; uVar28 < this->mScene->mNumMeshes; uVar28 = uVar28 + 1) {
          paVar5 = this->mScene->mMeshes[uVar28];
          for (uVar30 = 0; uVar30 < paVar5->mNumBones; uVar30 = uVar30 + 1) {
            this_00 = paVar5->mBones[uVar30];
            bVar22 = aiString::operator==(&this_00->mName,(aiString *)this_01);
            if (bVar22) {
              local_78.d1 = abs.d1;
              local_78.d2 = abs.d2;
              local_78.d3 = abs.d3;
              local_78.d4 = abs.d4;
              local_78.c1 = abs.c1;
              local_78.c2 = abs.c2;
              local_78.c3 = abs.c3;
              local_78.c4 = abs.c4;
              local_78.b1 = abs.b1;
              local_78.b2 = abs.b2;
              local_78.b3 = abs.b3;
              local_78.b4 = abs.b4;
              local_78.a1 = abs.a1;
              local_78.a2 = abs.a2;
              local_78.a3 = abs.a3;
              local_78.a4 = abs.a4;
              paVar25 = aiMatrix4x4t<float>::Inverse(&local_78);
              fVar1 = paVar25->a2;
              fVar2 = paVar25->a3;
              fVar3 = paVar25->a4;
              fVar10 = paVar25->b1;
              fVar11 = paVar25->b2;
              fVar12 = paVar25->b3;
              fVar13 = paVar25->b4;
              fVar14 = paVar25->c1;
              fVar15 = paVar25->c2;
              fVar16 = paVar25->c3;
              fVar17 = paVar25->c4;
              fVar18 = paVar25->d1;
              fVar19 = paVar25->d2;
              fVar20 = paVar25->d3;
              fVar21 = paVar25->d4;
              (this_00->mOffsetMatrix).a1 = paVar25->a1;
              (this_00->mOffsetMatrix).a2 = fVar1;
              (this_00->mOffsetMatrix).a3 = fVar2;
              (this_00->mOffsetMatrix).a4 = fVar3;
              (this_00->mOffsetMatrix).b1 = fVar10;
              (this_00->mOffsetMatrix).b2 = fVar11;
              (this_00->mOffsetMatrix).b3 = fVar12;
              (this_00->mOffsetMatrix).b4 = fVar13;
              (this_00->mOffsetMatrix).c1 = fVar14;
              (this_00->mOffsetMatrix).c2 = fVar15;
              (this_00->mOffsetMatrix).c3 = fVar16;
              (this_00->mOffsetMatrix).c4 = fVar17;
              (this_00->mOffsetMatrix).d1 = fVar18;
              (this_00->mOffsetMatrix).d2 = fVar19;
              (this_00->mOffsetMatrix).d3 = fVar20;
              (this_00->mOffsetMatrix).d4 = fVar21;
            }
          }
        }
        local_104 = local_104 + 1;
        rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[](hadit,uVar26);
        *rVar31._M_p = *rVar31._M_p | rVar31._M_mask;
        CollectChildJoints(this,joints,hadit,this_01,&abs);
      }
    }
  }
  return;
}

Assistant:

void MS3DImporter :: CollectChildJoints(const std::vector<TempJoint>& joints,
    std::vector<bool>& hadit,
    aiNode* nd,
    const aiMatrix4x4& absTrafo)
{
    unsigned int cnt = 0;
    for(size_t i = 0; i < joints.size(); ++i) {
        if (!hadit[i] && !strcmp(joints[i].parentName,nd->mName.data)) {
            ++cnt;
        }
    }

    nd->mChildren = new aiNode*[nd->mNumChildren = cnt];
    cnt = 0;
    for(size_t i = 0; i < joints.size(); ++i) {
        if (!hadit[i] && !strcmp(joints[i].parentName,nd->mName.data)) {
            aiNode* ch = nd->mChildren[cnt++] = new aiNode(joints[i].name);
            ch->mParent = nd;

            ch->mTransformation = aiMatrix4x4::Translation(joints[i].position,aiMatrix4x4()=aiMatrix4x4())*
                aiMatrix4x4().FromEulerAnglesXYZ(joints[i].rotation);

            const aiMatrix4x4 abs = absTrafo*ch->mTransformation;
            for(unsigned int a = 0; a < mScene->mNumMeshes; ++a) {
                aiMesh* const msh = mScene->mMeshes[a];
                for(unsigned int n = 0; n < msh->mNumBones; ++n) {
                    aiBone* const bone = msh->mBones[n];

                    if(bone->mName == ch->mName) {
                        bone->mOffsetMatrix = aiMatrix4x4(abs).Inverse();
                    }
                }
            }

            hadit[i] = true;
            CollectChildJoints(joints,hadit,ch,abs);
        }
    }
}